

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O3

void HorizontalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  long lVar1;
  uint8_t *preds;
  ulong uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  int iVar5;
  
  *filtered_data = *data;
  if (1 < width) {
    uVar2 = 0;
    do {
      filtered_data[uVar2 + 1] = data[uVar2 + 1] - data[uVar2];
      uVar2 = uVar2 + 1;
    } while (width - 1 != uVar2);
  }
  if (1 < height) {
    lVar1 = (long)stride;
    puVar3 = filtered_data + lVar1 + 1;
    puVar4 = data + lVar1 + 1;
    iVar5 = 1;
    do {
      filtered_data[lVar1] = data[lVar1] - *data;
      if (1 < width) {
        uVar2 = 0;
        do {
          puVar3[uVar2] = puVar4[uVar2] - puVar4[uVar2 - 1];
          uVar2 = uVar2 + 1;
        } while (width - 1 != uVar2);
      }
      data = data + lVar1;
      filtered_data = filtered_data + lVar1;
      iVar5 = iVar5 + 1;
      puVar3 = puVar3 + lVar1;
      puVar4 = puVar4 + lVar1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static WEBP_INLINE void DoHorizontalFilter_C(const uint8_t* in,
                                             int width, int height, int stride,
                                             int row, int num_rows,
                                             int inverse, uint8_t* out) {
  const uint8_t* preds;
  const size_t start_offset = row * stride;
  const int last_row = row + num_rows;
  SANITY_CHECK(in, out);
  in += start_offset;
  out += start_offset;
  preds = inverse ? out : in;

  if (row == 0) {
    // Leftmost pixel is the same as input for topmost scanline.
    out[0] = in[0];
    PredictLine_C(in + 1, preds, out + 1, width - 1, inverse);
    row = 1;
    preds += stride;
    in += stride;
    out += stride;
  }

  // Filter line-by-line.
  while (row < last_row) {
    // Leftmost pixel is predicted from above.
    PredictLine_C(in, preds - stride, out, 1, inverse);
    PredictLine_C(in + 1, preds, out + 1, width - 1, inverse);
    ++row;
    preds += stride;
    in += stride;
    out += stride;
  }
}